

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManChoiceMiter_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  
  if (pObj->Value != 0xffffffff) {
    return pObj->Value;
  }
  Gia_ManChoiceMiter_rec(pNew,p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
  uVar2 = (uint)*(undefined8 *)pObj;
  if ((~uVar2 & 0x1fffffff) == 0 || -1 < (int)uVar2) {
    Gia_ManChoiceMiter_rec
              (pNew,p,pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff));
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    uVar2 = Gia_ManHashAnd(pNew,iVar1,iLit1);
  }
  else {
    iVar1 = Gia_ObjFanin0Copy(pObj);
    uVar2 = Gia_ManAppendCo(pNew,iVar1);
  }
  pObj->Value = uVar2;
  return uVar2;
}

Assistant:

int Gia_ManChoiceMiter_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    Gia_ManChoiceMiter_rec( pNew, p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCo(pObj) )
        return pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManChoiceMiter_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}